

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_dump(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  int iVar3;
  uint strip;
  luaL_Buffer b;
  luaL_Buffer local_2020;
  
  pTVar2 = L->base;
  if ((pTVar2 < L->top) && ((pTVar2->field_2).it == 0xfffffff7)) {
    uVar1 = (pTVar2->u32).lo;
    strip = 0;
    if (pTVar2 + 1 < L->top) {
      strip = (uint)(*(uint *)((long)pTVar2 + 0xc) < 0xfffffffe);
    }
    L->top = pTVar2 + 1;
    local_2020.p = local_2020.buffer;
    local_2020.lvl = 0;
    local_2020.L = L;
    if (*(char *)((ulong)uVar1 + 6) == '\0') {
      iVar3 = lj_bcwrite(L,(GCproto *)((ulong)*(uint *)((ulong)uVar1 + 0x10) - 0x40),writer_buf,
                         &local_2020,strip);
      if (iVar3 == 0) {
        emptybuffer(&local_2020);
        lua_concat(local_2020.L,local_2020.lvl);
        return 1;
      }
    }
    lj_err_caller(L,LJ_ERR_STRDUMP);
  }
  lj_err_argt(L,1,6);
}

Assistant:

LJLIB_CF(string_dump)
{
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  int strip = L->base+1 < L->top && tvistruecond(L->base+1);
  luaL_Buffer b;
  L->top = L->base+1;
  luaL_buffinit(L, &b);
  if (!isluafunc(fn) || lj_bcwrite(L, funcproto(fn), writer_buf, &b, strip))
    lj_err_caller(L, LJ_ERR_STRDUMP);
  luaL_pushresult(&b);
  return 1;
}